

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

TestFactoryBase * __thiscall
testing::internal::TestMetaFactory<DriverTest_Glob_Test>::CreateTestFactory
          (TestMetaFactory<DriverTest_Glob_Test> *this,ParamType *parameter)

{
  ParameterizedTestFactory<DriverTest_Glob_Test> *this_00;
  ParamType local_30;
  
  this_00 = (ParameterizedTestFactory<DriverTest_Glob_Test> *)operator_new(0x28);
  std::__cxx11::string::string((string *)&local_30,(string *)parameter);
  ParameterizedTestFactory<DriverTest_Glob_Test>::ParameterizedTestFactory(this_00,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return &this_00->super_TestFactoryBase;
}

Assistant:

virtual TestFactoryBase* CreateTestFactory(ParamType parameter) {
    return new ParameterizedTestFactory<TestCase>(parameter);
  }